

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_store_fpr64(DisasContext_conflict6 *ctx,TCGv_i64 t,int reg)

{
  TCGTemp *ts;
  uint in_ECX;
  undefined4 in_register_00000014;
  TCGv_i64 arg2;
  uintptr_t o_1;
  
  arg2 = (TCGv_i64)CONCAT44(in_register_00000014,reg);
  if (((ulong)ctx & 0x40) == 0) {
    tcg_gen_deposit_i64_mips64el
              ((TCGContext_conflict6 *)t,
               *(TCGv_i64 *)(t + (ulong)(in_ECX & 0xfffffffe) * 8 + 0xb040),
               *(TCGv_i64 *)(t + (ulong)(in_ECX & 0xfffffffe) * 8 + 0xb040),arg2,0,0x20);
    ts = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)t,TCG_TYPE_I64,false);
    tcg_gen_shri_i64_mips64el((TCGContext_conflict6 *)t,(TCGv_i64)((long)ts - (long)t),arg2,0x20);
    tcg_gen_deposit_i64_mips64el
              ((TCGContext_conflict6 *)t,*(TCGv_i64 *)(t + (ulong)(in_ECX | 1) * 8 + 0xb040),
               *(TCGv_i64 *)(t + (ulong)(in_ECX | 1) * 8 + 0xb040),(TCGv_i64)((long)ts - (long)t),0,
               0x20);
    tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)t,ts);
    return;
  }
  if (*(TCGv_i64 *)(t + (ulong)in_ECX * 8 + 0xb040) != arg2) {
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)t,INDEX_op_mov_i64,
               (TCGArg)(*(TCGv_i64 *)(t + (ulong)in_ECX * 8 + 0xb040) + (long)t),
               (TCGArg)(arg2 + (long)t));
    return;
  }
  return;
}

Assistant:

static void gen_store_fpr64(DisasContext *ctx, TCGv_i64 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_F64) {
        tcg_gen_mov_i64(tcg_ctx, tcg_ctx->fpu_f64[reg], t);
    } else {
        TCGv_i64 t0;
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->fpu_f64[reg & ~1], tcg_ctx->fpu_f64[reg & ~1], t, 0, 32);
        t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shri_i64(tcg_ctx, t0, t, 32);
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->fpu_f64[reg | 1], tcg_ctx->fpu_f64[reg | 1], t0, 0, 32);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
}